

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.h
# Opt level: O3

void google::protobuf::TestUtil::SetOptionalFields<edition_unittest::TestAllTypes>
               (TestAllTypes *message)

{
  byte *pbVar1;
  bool bVar2;
  TestAllTypes_OptionalGroup *pTVar3;
  TestAllTypes_NestedMessage *pTVar4;
  ForeignMessage *pFVar5;
  ImportMessage *pIVar6;
  PublicImportMessage *pPVar7;
  FieldDescriptor *pFVar8;
  Arena *pAVar9;
  string_view value;
  string_view value_00;
  string_view name;
  string_view name_00;
  string_view src;
  Metadata MVar10;
  Metadata MVar11;
  string local_68;
  string local_48;
  
  *(undefined8 *)((long)&message->field_0 + 0x290) = 0x6700000065;
  (message->field_0)._impl_.optional_int64_ = 0x66;
  (message->field_0)._impl_.optional_uint64_ = 0x68;
  *(undefined8 *)((long)&message->field_0 + 0x2a8) = 0x6b00000069;
  (message->field_0)._impl_.optional_sint64_ = 0x6a;
  (message->field_0)._impl_.optional_fixed64_ = 0x6c;
  *(undefined8 *)((long)&message->field_0 + 0x2c0) = 0x42de00000000006d;
  (message->field_0)._impl_.optional_sfixed64_ = 0x6e;
  (message->field_0)._impl_.optional_double_ = 112.0;
  (message->field_0)._impl_.optional_bool_ = true;
  (message->field_0)._impl_._has_bits_.has_bits_[0] =
       (message->field_0)._impl_._has_bits_.has_bits_[0] | 0xfff801;
  pAVar9 = (Arena *)(message->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar9 & 1) != 0) {
    pAVar9 = *(Arena **)((ulong)pAVar9 & 0xfffffffffffffffe);
  }
  value._M_str = "115";
  value._M_len = 3;
  protobuf::internal::ArenaStringPtr::Set(&(message->field_0)._impl_.optional_string_,value,pAVar9);
  *(byte *)&message->field_0 = *(byte *)&message->field_0 | 2;
  pAVar9 = (Arena *)(message->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar9 & 1) != 0) {
    pAVar9 = *(Arena **)((ulong)pAVar9 & 0xfffffffffffffffe);
  }
  value_00._M_str = "116";
  value_00._M_len = 3;
  protobuf::internal::ArenaStringPtr::Set
            (&(message->field_0)._impl_.optional_bytes_,value_00,pAVar9);
  *(byte *)&message->field_0 = *(byte *)&message->field_0 | 0x10;
  pTVar3 = (message->field_0)._impl_.optionalgroup_;
  if (pTVar3 == (TestAllTypes_OptionalGroup *)0x0) {
    pAVar9 = (Arena *)(message->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if (((ulong)pAVar9 & 1) != 0) {
      pAVar9 = *(Arena **)((ulong)pAVar9 & 0xfffffffffffffffe);
    }
    pTVar3 = (TestAllTypes_OptionalGroup *)
             Arena::DefaultConstruct<edition_unittest::TestAllTypes_OptionalGroup>(pAVar9);
    (message->field_0)._impl_.optionalgroup_ = pTVar3;
  }
  (pTVar3->field_0)._impl_.a_ = 0x75;
  *(byte *)&pTVar3->field_0 = *(byte *)&pTVar3->field_0 | 1;
  *(byte *)&message->field_0 = *(byte *)&message->field_0 | 0x20;
  pTVar4 = (message->field_0)._impl_.optional_nested_message_;
  if (pTVar4 == (TestAllTypes_NestedMessage *)0x0) {
    pAVar9 = (Arena *)(message->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if (((ulong)pAVar9 & 1) != 0) {
      pAVar9 = *(Arena **)((ulong)pAVar9 & 0xfffffffffffffffe);
    }
    pTVar4 = (TestAllTypes_NestedMessage *)
             Arena::DefaultConstruct<edition_unittest::TestAllTypes_NestedMessage>(pAVar9);
    (message->field_0)._impl_.optional_nested_message_ = pTVar4;
  }
  (pTVar4->field_0)._impl_.bb_ = 0x76;
  *(byte *)&pTVar4->field_0 = *(byte *)&pTVar4->field_0 | 1;
  *(byte *)&message->field_0 = *(byte *)&message->field_0 | 0x40;
  pFVar5 = (message->field_0)._impl_.optional_foreign_message_;
  if (pFVar5 == (ForeignMessage *)0x0) {
    pAVar9 = (Arena *)(message->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if (((ulong)pAVar9 & 1) != 0) {
      pAVar9 = *(Arena **)((ulong)pAVar9 & 0xfffffffffffffffe);
    }
    pFVar5 = (ForeignMessage *)Arena::DefaultConstruct<edition_unittest::ForeignMessage>(pAVar9);
    (message->field_0)._impl_.optional_foreign_message_ = pFVar5;
  }
  (pFVar5->field_0)._impl_.c_ = 0x77;
  *(byte *)&pFVar5->field_0 = *(byte *)&pFVar5->field_0 | 1;
  *(byte *)&message->field_0 = *(byte *)&message->field_0 | 0x80;
  pIVar6 = (message->field_0)._impl_.optional_import_message_;
  if (pIVar6 == (ImportMessage *)0x0) {
    pAVar9 = (Arena *)(message->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if (((ulong)pAVar9 & 1) != 0) {
      pAVar9 = *(Arena **)((ulong)pAVar9 & 0xfffffffffffffffe);
    }
    pIVar6 = (ImportMessage *)Arena::DefaultConstruct<proto2_unittest_import::ImportMessage>(pAVar9)
    ;
    (message->field_0)._impl_.optional_import_message_ = pIVar6;
  }
  (pIVar6->field_0)._impl_.d_ = 0x78;
  *(byte *)&pIVar6->field_0 = *(byte *)&pIVar6->field_0 | 1;
  pbVar1 = (byte *)((long)&message->field_0 + 1);
  *pbVar1 = *pbVar1 | 1;
  pPVar7 = (message->field_0)._impl_.optional_public_import_message_;
  if (pPVar7 == (PublicImportMessage *)0x0) {
    pAVar9 = (Arena *)(message->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if (((ulong)pAVar9 & 1) != 0) {
      pAVar9 = *(Arena **)((ulong)pAVar9 & 0xfffffffffffffffe);
    }
    pPVar7 = (PublicImportMessage *)
             Arena::DefaultConstruct<proto2_unittest_import::PublicImportMessage>(pAVar9);
    (message->field_0)._impl_.optional_public_import_message_ = pPVar7;
  }
  (pPVar7->field_0)._impl_.e_ = 0x7e;
  *(byte *)&pPVar7->field_0 = *(byte *)&pPVar7->field_0 | 1;
  pbVar1 = (byte *)((long)&message->field_0 + 1);
  *pbVar1 = *pbVar1 | 2;
  pTVar4 = (message->field_0)._impl_.optional_lazy_message_;
  if (pTVar4 == (TestAllTypes_NestedMessage *)0x0) {
    pAVar9 = (Arena *)(message->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if (((ulong)pAVar9 & 1) != 0) {
      pAVar9 = *(Arena **)((ulong)pAVar9 & 0xfffffffffffffffe);
    }
    pTVar4 = (TestAllTypes_NestedMessage *)
             Arena::DefaultConstruct<edition_unittest::TestAllTypes_NestedMessage>(pAVar9);
    (message->field_0)._impl_.optional_lazy_message_ = pTVar4;
  }
  (pTVar4->field_0)._impl_.bb_ = 0x7f;
  *(byte *)&pTVar4->field_0 = *(byte *)&pTVar4->field_0 | 1;
  pbVar1 = (byte *)((long)&message->field_0 + 1);
  *pbVar1 = *pbVar1 | 4;
  pTVar4 = (message->field_0)._impl_.optional_unverified_lazy_message_;
  if (pTVar4 == (TestAllTypes_NestedMessage *)0x0) {
    pAVar9 = (Arena *)(message->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if (((ulong)pAVar9 & 1) != 0) {
      pAVar9 = *(Arena **)((ulong)pAVar9 & 0xfffffffffffffffe);
    }
    pTVar4 = (TestAllTypes_NestedMessage *)
             Arena::DefaultConstruct<edition_unittest::TestAllTypes_NestedMessage>(pAVar9);
    (message->field_0)._impl_.optional_unverified_lazy_message_ = pTVar4;
  }
  (pTVar4->field_0)._impl_.bb_ = 0x80;
  *(byte *)&pTVar4->field_0 = *(byte *)&pTVar4->field_0 | 1;
  bVar2 = protobuf::internal::ValidateEnum
                    (3,(uint32_t *)edition_unittest::TestAllTypes_NestedEnum_internal_data_);
  if (!bVar2) {
    __assert_fail("::google::protobuf::internal::ValidateEnum( value, ::edition_unittest::TestAllTypes_NestedEnum_internal_data_)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/google/protobuf/edition_unittest.pb.h"
                  ,0xaa2e,
                  "void edition_unittest::TestAllTypes::_internal_set_optional_nested_enum(::edition_unittest::TestAllTypes_NestedEnum)"
                 );
  }
  (message->field_0)._impl_.optional_nested_enum_ = 3;
  pbVar1 = (byte *)((long)&message->field_0 + 3);
  *pbVar1 = *pbVar1 | 2;
  bVar2 = protobuf::internal::ValidateEnum
                    (6,(uint32_t *)edition_unittest::ForeignEnum_internal_data_);
  if (!bVar2) {
    __assert_fail("::google::protobuf::internal::ValidateEnum( value, ::edition_unittest::ForeignEnum_internal_data_)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/google/protobuf/edition_unittest.pb.h"
                  ,0xaa4d,
                  "void edition_unittest::TestAllTypes::_internal_set_optional_foreign_enum(::edition_unittest::ForeignEnum)"
                 );
  }
  (message->field_0)._impl_.optional_foreign_enum_ = 6;
  pbVar1 = (byte *)((long)&message->field_0 + 3);
  *pbVar1 = *pbVar1 | 4;
  bVar2 = protobuf::internal::ValidateEnum
                    (9,(uint32_t *)&proto2_unittest_import::ImportEnum_internal_data_);
  if (bVar2) {
    (message->field_0)._impl_.optional_import_enum_ = 9;
    pbVar1 = (byte *)((long)&message->field_0 + 3);
    *pbVar1 = *pbVar1 | 1;
    MVar10 = edition_unittest::TestAllTypes::GetMetadata
                       ((TestAllTypes *)&edition_unittest::_TestAllTypes_default_instance_);
    MVar11 = edition_unittest::TestAllTypes::GetMetadata
                       ((TestAllTypes *)&edition_unittest::_TestAllTypes_default_instance_);
    name._M_str = "optional_string_piece";
    name._M_len = 0x15;
    pFVar8 = Descriptor::FindFieldByName(MVar11.descriptor,name);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"124","");
    Reflection::SetString(MVar10.reflection,&message->super_Message,pFVar8,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    MVar10 = edition_unittest::TestAllTypes::GetMetadata
                       ((TestAllTypes *)&edition_unittest::_TestAllTypes_default_instance_);
    MVar11 = edition_unittest::TestAllTypes::GetMetadata
                       ((TestAllTypes *)&edition_unittest::_TestAllTypes_default_instance_);
    name_00._M_str = "optional_cord";
    name_00._M_len = 0xd;
    pFVar8 = Descriptor::FindFieldByName(MVar11.descriptor,name_00);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"125","");
    Reflection::SetString(MVar10.reflection,&message->super_Message,pFVar8,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    pbVar1 = (byte *)((long)&message->field_0 + 3);
    *pbVar1 = *pbVar1 | 0x80;
    src._M_str = "optional bytes cord";
    src._M_len = 0x13;
    absl::lts_20250127::Cord::operator=(&(message->field_0)._impl_.optional_bytes_cord_,src);
    return;
  }
  __assert_fail("::google::protobuf::internal::ValidateEnum( value, ::proto2_unittest_import::ImportEnum_internal_data_)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/google/protobuf/edition_unittest.pb.h"
                ,0xaa6c,
                "void edition_unittest::TestAllTypes::_internal_set_optional_import_enum(::proto2_unittest_import::ImportEnum)"
               );
}

Assistant:

void SetOptionalFields(TestAllTypes* message) {
  message->set_optional_int32(101);
  message->set_optional_int64(102);
  message->set_optional_uint32(103);
  message->set_optional_uint64(104);
  message->set_optional_sint32(105);
  message->set_optional_sint64(106);
  message->set_optional_fixed32(107);
  message->set_optional_fixed64(108);
  message->set_optional_sfixed32(109);
  message->set_optional_sfixed64(110);
  message->set_optional_float(111);
  message->set_optional_double(112);
  message->set_optional_bool(true);
  message->set_optional_string("115");
  message->set_optional_bytes("116");

  message->mutable_optionalgroup()->set_a(117);
  message->mutable_optional_nested_message()->set_bb(118);
  message->mutable_optional_foreign_message()->set_c(119);
  message->mutable_optional_import_message()->set_d(120);
  message->mutable_optional_public_import_message()->set_e(126);
  message->mutable_optional_lazy_message()->set_bb(127);
  message->mutable_optional_unverified_lazy_message()->set_bb(128);

  message->set_optional_nested_enum(TestAllTypes::BAZ);
  message->set_optional_foreign_enum(ForeignEnum<TestAllTypes>::FOREIGN_BAZ);
  message->set_optional_import_enum(ImportEnum<TestAllTypes>::IMPORT_BAZ);

  // StringPiece and Cord fields are only accessible via reflection in the
  // open source release; see comments in compiler/cpp/string_field.cc.
#ifndef PROTOBUF_TEST_NO_DESCRIPTORS
  message->GetReflection()->SetString(
      message,
      message->GetDescriptor()->FindFieldByName("optional_string_piece"),
      "124");
  message->GetReflection()->SetString(
      message, message->GetDescriptor()->FindFieldByName("optional_cord"),
      "125");
#endif  // !PROTOBUF_TEST_NO_DESCRIPTORS
  message->set_optional_bytes_cord("optional bytes cord");
}